

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

int __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<float>_>::copy
          (TypedAttribute<Imath_2_5::Vec3<float>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Attribute *this_00;
  TypedAttribute<Imath_2_5::Vec3<float>_> *pTVar1;
  
  this_00 = (Attribute *)operator_new(0x18);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__Attribute_0049bf80;
  pTVar1 = cast(&this->super_Attribute);
  this_00[1]._vptr_Attribute = *(_func_int ***)&pTVar1->_value;
  *(float *)&this_00[2]._vptr_Attribute = (pTVar1->_value).z;
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}